

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O3

void __thiscall leveldb::VersionSet::AppendVersion(VersionSet *this,Version *v)

{
  Version *pVVar1;
  int iVar2;
  
  if (v->refs_ != 0) {
    __assert_fail("v->refs_ == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set.cc"
                  ,0x30f,"void leveldb::VersionSet::AppendVersion(Version *)");
  }
  pVVar1 = this->current_;
  if (pVVar1 != v) {
    if (pVVar1 == (Version *)0x0) {
      iVar2 = 1;
    }
    else {
      Version::Unref(pVVar1);
      iVar2 = v->refs_ + 1;
    }
    this->current_ = v;
    v->refs_ = iVar2;
    pVVar1 = (this->dummy_versions_).prev_;
    v->prev_ = pVVar1;
    v->next_ = &this->dummy_versions_;
    pVVar1->next_ = v;
    v->next_->prev_ = v;
    return;
  }
  __assert_fail("v != current_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set.cc"
                ,0x310,"void leveldb::VersionSet::AppendVersion(Version *)");
}

Assistant:

void VersionSet::AppendVersion(Version* v) {
  // Make "v" current
  assert(v->refs_ == 0);
  assert(v != current_);
  if (current_ != nullptr) {
    current_->Unref();
  }
  current_ = v;
  v->Ref();

  // Append to linked list
  v->prev_ = dummy_versions_.prev_;
  v->next_ = &dummy_versions_;
  v->prev_->next_ = v;
  v->next_->prev_ = v;
}